

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

void __thiscall SpecificStrategy::process(SpecificStrategy *this)

{
  CFG *this_00;
  byte bVar1;
  bool bVar2;
  Status SVar3;
  reference ppCVar4;
  Addr AVar5;
  void *pvVar6;
  ostream *poVar7;
  undefined1 local_500 [8];
  Stats bStats;
  Stats aStats;
  Report report;
  CFG *bCFG;
  Addr addr;
  CFG *aCFG;
  iterator __end1;
  iterator __begin1;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__range1;
  int cfgs;
  undefined1 local_70 [8];
  anon_struct_96_2_3bc8cf49 total;
  SpecificStrategy *this_local;
  
  total.missing._40_8_ = this;
  process()::$_0::__0((__0 *)local_70);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,
                             "cfg,type,instrs,blocks_perfect,blocks_conflict,");
    poVar7 = std::operator<<(poVar7,"phantoms,");
    poVar7 = std::operator<<(poVar7,"edges_internal_perfect,edges_internal_conflict,");
    poVar7 = std::operator<<(poVar7,"edges_external_perfect,edges_external_conflict,");
    poVar7 = std::operator<<(poVar7,"calls,indirect");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  __range1._0_4_ = 0;
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1,
                      (this->super_Strategy).m_a);
  __end1 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin
                     ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  aCFG = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::end
                          ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&aCFG), bVar2) {
    ppCVar4 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&__end1);
    this_00 = *ppCVar4;
    SVar3 = CFG::status(this_00);
    if (SVar3 == VALID) {
      AVar5 = CFG::addr(this_00);
      bVar2 = Strategy::isAddrInRange(&this->super_Strategy,AVar5);
      if (((bVar2) &&
          (report.missing.indirects._M_t._M_impl.super__Rb_tree_header._M_node_count =
                (size_t)CFGsContainer::cfg((this->super_Strategy).m_b,AVar5),
          (CFG *)report.missing.indirects._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          (CFG *)0x0)) &&
         (SVar3 = CFG::status((CFG *)report.missing.indirects._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count), SVar3 == VALID)) {
        compareCFGs((Report *)&aStats.calls,this,this_00,
                    (CFG *)report.missing.indirects._M_t._M_impl.super__Rb_tree_header._M_node_count
                   );
        extractStats((Stats *)&bStats.calls,this,(Info *)&aStats.calls);
        extractStats((Stats *)local_500,this,
                     (Info *)&report.present.indirects._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
        if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
          std::ostream::operator<<(&std::cout,std::hex);
          poVar7 = std::operator<<((ostream *)&std::cout,"CFG 0x");
          AVar5 = CFG::addr(this_00);
          pvVar6 = (void *)std::ostream::operator<<(poVar7,AVar5);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(&std::cout,std::dec);
          poVar7 = std::operator<<((ostream *)&std::cout,"present: ");
          poVar7 = operator<<(poVar7,(Stats *)&bStats.calls);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&std::cout,"missing: ");
          poVar7 = operator<<(poVar7,(Stats *)local_500);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        bVar1 = std::ofstream::is_open();
        if ((bVar1 & 1) != 0) {
          poVar7 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"0x");
          pvVar6 = (void *)std::ostream::operator<<(poVar7,std::hex);
          AVar5 = CFG::addr(this_00);
          pvVar6 = (void *)std::ostream::operator<<(pvVar6,AVar5);
          poVar7 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar7 = std::operator<<(poVar7,",present,");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)aStats._vptr_Stats);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats._vptr_Stats._4_4_);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.instrs);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.blocks.perfect);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.blocks.conflict);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.phantoms);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.edges.internal.perfect);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.edges.internal.conflict);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,aStats.edges.external.perfect);
          poVar7 = std::operator<<(poVar7,",");
          pvVar6 = (void *)std::ostream::operator<<(poVar7,aStats.edges.external.conflict);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&(this->super_Strategy).m_fout,"0x");
          pvVar6 = (void *)std::ostream::operator<<(poVar7,std::hex);
          AVar5 = CFG::addr((CFG *)report.missing.indirects._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
          pvVar6 = (void *)std::ostream::operator<<(pvVar6,AVar5);
          poVar7 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar7 = std::operator<<(poVar7,",missing,");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)bStats._vptr_Stats);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats._vptr_Stats._4_4_);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.instrs);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.blocks.perfect);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.blocks.conflict);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.phantoms);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.edges.internal.perfect);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.edges.internal.conflict);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,bStats.edges.external.perfect);
          poVar7 = std::operator<<(poVar7,",");
          pvVar6 = (void *)std::ostream::operator<<(poVar7,bStats.edges.external.conflict);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
        Stats::operator+=((Stats *)local_70,(Stats *)&bStats.calls);
        Stats::operator+=((Stats *)&total.present.calls,(Stats *)local_500);
        __range1._0_4_ = (int)__range1 + 1;
        Stats::~Stats((Stats *)local_500);
        Stats::~Stats((Stats *)&bStats.calls);
        Report::~Report((Report *)&aStats.calls);
      }
    }
    std::_Rb_tree_const_iterator<CFG_*>::operator++(&__end1);
  }
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
            ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&__begin1);
  if (((this->super_Strategy).m_config.detailed & 1U) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Total: ");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"present: cfgs(");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)__range1);
  poVar7 = std::operator<<(poVar7,"), ");
  poVar7 = operator<<(poVar7,(Stats *)local_70);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"missing: cfgs(0), ");
  poVar7 = operator<<(poVar7,(Stats *)&total.present.calls);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  process()::$_0::~__0((__0 *)local_70);
  return;
}

Assistant:

void SpecificStrategy::process() {
	struct {
		SpecificStrategy::Stats present, missing;
	} total;

	if (m_fout.is_open())
		m_fout << "cfg,type,instrs,blocks_perfect,blocks_conflict,"
		       << "phantoms,"
		       << "edges_internal_perfect,edges_internal_conflict,"
			   << "edges_external_perfect,edges_external_conflict,"
			   << "calls,indirect" << std::endl;

	int cfgs = 0;
	for (CFG* aCFG : m_a->cfgs()) {
		if (aCFG->status() != CFG::VALID)
			continue;

		Addr addr = aCFG->addr();
		if (!this->isAddrInRange(addr))
			continue;

		CFG* bCFG = m_b->cfg(addr);
		if (bCFG == 0 || bCFG->status() != CFG::VALID)
			continue;

		SpecificStrategy::Report report = compareCFGs(aCFG, bCFG);

		SpecificStrategy::Stats aStats = this->extractStats(report.present);
		SpecificStrategy::Stats bStats = this->extractStats(report.missing);

		if (m_config.detailed) {
			std::cout << std::hex;
			std::cout << "CFG 0x" << aCFG->addr() << std::endl;
			std::cout << std::dec;
			std::cout << "present: " << aStats << std::endl;
			std::cout << "missing: " << bStats << std::endl;
			std::cout << std::endl;
		}

		if (m_fout.is_open()) {
			m_fout << "0x" << std::hex << aCFG->addr() << std::dec
					<< ",present," << aStats.instrs << ","
					<< aStats.blocks.perfect << "," << aStats.blocks.conflict << ","
					<< aStats.phantoms << ","
					<< aStats.edges.internal.perfect << "," << aStats.edges.internal.conflict << ","
					<< aStats.edges.external.perfect << "," << aStats.edges.external.conflict << ","
					<< aStats.calls << "," << aStats.indirects << std::endl;

			m_fout << "0x" << std::hex << bCFG->addr() << std::dec
					<< ",missing," << bStats.instrs << ","
					<< bStats.blocks.perfect << "," << bStats.blocks.conflict << ","
					<< bStats.phantoms << ","
					<< bStats.edges.internal.perfect << "," << bStats.edges.internal.conflict << ","
					<< bStats.edges.external.perfect << "," << bStats.edges.external.conflict << ","
					<< bStats.calls << "," << bStats.indirects << std::endl;
		}

		total.present += aStats;
		total.missing += bStats;

		cfgs++;
	}

	if (m_config.detailed)
		std::cout << "Total: " << std::endl;
	std::cout << "present: cfgs(" << cfgs << "), " << total.present << std::endl;
	std::cout << "missing: cfgs(0), " << total.missing << std::endl;
}